

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloatExpanded
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  ostringstream *this_00;
  bool bVar1;
  Hex<8UL> hex;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  StateQueryMemoryWriteGuard<int> state;
  undefined1 local_1b0 [384];
  
  lVar3 = (long)((reference * 4.2949673e+09 + -1.0) * 0.5);
  uVar2 = lVar3 + 0x3ff;
  if (0x7ffffffe < (long)uVar2) {
    uVar2 = 0x7fffffff;
  }
  if ((long)uVar2 < -0x7fffffff) {
    uVar2 = 0xffffffff80000000;
  }
  uVar4 = lVar3 - 0x3ff;
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0x7fffffff;
  }
  if ((long)uVar4 < -0x7fffffff) {
    uVar4 = 0xffffffff80000000;
  }
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&state,testCtx)
  ;
  if ((bVar1) && ((int)uVar2 < state.m_value || state.m_value < (int)uVar4)) {
    local_1b0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected in range [");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar4 & 0xffffffff));
    std::operator<<((ostream *)this_00,",");
    tcu::Format::operator<<((ostream *)this_00,(Hex<8UL>)(uVar2 & 0xffffffff));
    std::operator<<((ostream *)this_00,"]; got ");
    hex.value._4_4_ = 0;
    hex.value._0_4_ = state.m_value;
    tcu::Format::operator<<((ostream *)this_00,hex);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloatExpanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	DE_ASSERT(de::inRange(reference, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint expectedGLStateMax = clampToGLint(expandGLFloatToInteger(reference) + FLOAT_EXPANSION_E);
	const GLint expectedGLStateMin = clampToGLint(expandGLFloatToInteger(reference) - FLOAT_EXPANSION_E);

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < expectedGLStateMin || state > expectedGLStateMax)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected in range [" << toHex(expectedGLStateMin) << "," << toHex(expectedGLStateMax) << "]; got " << toHex((GLint)state) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}